

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strconv.c
# Opt level: O1

int jsonp_strtod(strbuffer_t *strbuffer,double *out)

{
  char cVar1;
  int iVar2;
  lconv *plVar3;
  char *pcVar4;
  int *piVar5;
  double dVar6;
  char *end;
  char *local_30;
  
  plVar3 = localeconv();
  cVar1 = *plVar3->decimal_point;
  if (cVar1 != '.') {
    pcVar4 = strchr(strbuffer->value,0x2e);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = cVar1;
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  dVar6 = strtod(strbuffer->value,&local_30);
  if (local_30 == strbuffer->value + strbuffer->length) {
    if ((ABS(dVar6) != INFINITY) || (iVar2 = -1, *piVar5 != 0x22)) {
      *out = dVar6;
      iVar2 = 0;
    }
    return iVar2;
  }
  __assert_fail("end == strbuffer->value + strbuffer->length",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/strconv.c"
                ,0x46,"int jsonp_strtod(strbuffer_t *, double *)");
}

Assistant:

int jsonp_strtod(strbuffer_t *strbuffer, double *out) {
    double value;
    char *end;

#if JSON_HAVE_LOCALECONV
    to_locale(strbuffer);
#endif

    errno = 0;
    value = strtod(strbuffer->value, &end);
    assert(end == strbuffer->value + strbuffer->length);

    if ((value == HUGE_VAL || value == -HUGE_VAL) && errno == ERANGE) {
        /* Overflow */
        return -1;
    }

    *out = value;
    return 0;
}